

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O2

AffixPatternMatcher *
icu_63::numparse::impl::AffixPatternMatcher::fromAffixPattern
          (AffixPatternMatcher *__return_storage_ptr__,UnicodeString *affixPattern,
          AffixTokenMatcherWarehouse *tokenWarehouse,parse_flags_t parseFlags,bool *success,
          UErrorCode *status)

{
  AffixPatternMatcherBuilder builder;
  AffixPatternMatcherBuilder local_60;
  
  if ((ushort)(affixPattern->fUnion).fStackFields.fLengthAndFlags < 0x20) {
    *success = false;
    (__return_storage_ptr__->fPattern).fBuffer.capacity = 0;
    (__return_storage_ptr__->fPattern).fBuffer.needToRelease = '\0';
    (__return_storage_ptr__->fPattern).fBuffer.field_0xd = 0;
    (__return_storage_ptr__->fPattern).fBuffer.stackArray[0] = L'\0';
    *(undefined8 *)((__return_storage_ptr__->fPattern).fBuffer.stackArray + 1) = 0;
    *(undefined8 *)&(__return_storage_ptr__->super_ArraySeriesMatcher).fMatchersLen = 0;
    (__return_storage_ptr__->fPattern).fBuffer.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->super_ArraySeriesMatcher).fMatchers.stackArray[1] =
         (NumberParseMatcher *)0x0;
    (__return_storage_ptr__->super_ArraySeriesMatcher).fMatchers.stackArray[2] =
         (NumberParseMatcher *)0x0;
    (__return_storage_ptr__->super_ArraySeriesMatcher).fMatchers.capacity = 0;
    (__return_storage_ptr__->super_ArraySeriesMatcher).fMatchers.needToRelease = '\0';
    *(undefined3 *)&(__return_storage_ptr__->super_ArraySeriesMatcher).fMatchers.field_0xd = 0;
    (__return_storage_ptr__->super_ArraySeriesMatcher).fMatchers.stackArray[0] =
         (NumberParseMatcher *)0x0;
    (__return_storage_ptr__->super_ArraySeriesMatcher).super_SeriesMatcher.super_CompositionMatcher.
    super_NumberParseMatcher._vptr_NumberParseMatcher = (_func_int **)0x0;
    (__return_storage_ptr__->super_ArraySeriesMatcher).fMatchers.ptr = (NumberParseMatcher **)0x0;
    AffixPatternMatcher(__return_storage_ptr__);
  }
  else {
    *success = true;
    if (((uint)parseFlags >> 9 & 1) == 0) {
      local_60.fIgnorables = tokenWarehouse->fSetupData->ignorables;
    }
    else {
      local_60.fIgnorables = (IgnorablesMatcher *)0x0;
    }
    local_60.fMatchers.ptr = local_60.fMatchers.stackArray;
    local_60.super_TokenConsumer._vptr_TokenConsumer =
         (_func_int **)&PTR__AffixPatternMatcherBuilder_003e1dc8;
    local_60.super_MutableMatcherCollection._vptr_MutableMatcherCollection =
         (_func_int **)&PTR__AffixPatternMatcherBuilder_003e1df8;
    local_60.fMatchers.capacity = 3;
    local_60.fMatchers.needToRelease = '\0';
    local_60.fMatchersLen = 0;
    local_60.fLastTypeOrCp = 0;
    local_60.fPattern = affixPattern;
    local_60.fWarehouse = tokenWarehouse;
    icu_63::number::impl::AffixUtils::iterateWithConsumer
              (affixPattern,&local_60.super_TokenConsumer,status);
    AffixPatternMatcherBuilder::build(__return_storage_ptr__,&local_60);
    AffixPatternMatcherBuilder::~AffixPatternMatcherBuilder(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

AffixPatternMatcher AffixPatternMatcher::fromAffixPattern(const UnicodeString& affixPattern,
                                                          AffixTokenMatcherWarehouse& tokenWarehouse,
                                                          parse_flags_t parseFlags, bool* success,
                                                          UErrorCode& status) {
    if (affixPattern.isEmpty()) {
        *success = false;
        return {};
    }
    *success = true;

    IgnorablesMatcher* ignorables;
    if (0 != (parseFlags & PARSE_FLAG_EXACT_AFFIX)) {
        ignorables = nullptr;
    } else {
        ignorables = &tokenWarehouse.ignorables();
    }

    AffixPatternMatcherBuilder builder(affixPattern, tokenWarehouse, ignorables);
    AffixUtils::iterateWithConsumer(affixPattern, builder, status);
    return builder.build();
}